

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3.c
# Opt level: O0

void mp3_calc_hdr(mp3_frame_t *frame)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int is_lsf;
  mp3_frame_t *frame_local;
  
  if (frame != (mp3_frame_t *)0x0) {
    bVar5 = frame->id == '\x03';
    if (bVar5) {
      frame->bitrate = bitratetable[frame->bitrate_index];
    }
    else {
      frame->bitrate = lsf_bitratetable[frame->bitrate_index];
    }
    frame->samplerate = (ulong)sampleratetable[frame->id][frame->samplerfindex];
    frame->samplelen = 0x480;
    if (bVar5) {
      iVar3 = 0x11;
      if (frame->mode != '\x03') {
        iVar3 = 0x20;
      }
      frame->si_size = (long)iVar3;
    }
    else {
      iVar3 = 9;
      if (frame->mode != '\x03') {
        iVar3 = 0x11;
      }
      frame->si_size = (long)iVar3;
    }
    frame->si_bitsize = frame->si_size << 3;
    if (bVar5) {
      frame->frame_size = frame->bitrate * 0x23280;
    }
    else {
      frame->frame_size = frame->bitrate * 72000;
    }
    frame->frame_size = frame->frame_size / frame->samplerate;
    frame->frame_size = (ulong)frame->padding_bit + frame->frame_size;
    frame->frame_data_size = (frame->frame_size - 4) - frame->si_size;
    if (frame->protected == '\0') {
      frame->frame_data_size = frame->frame_data_size - 2;
    }
    uVar1 = frame->frame_size;
    auVar7._8_4_ = (int)(uVar1 >> 0x20);
    auVar7._0_8_ = uVar1;
    auVar7._12_4_ = 0x45300000;
    uVar2 = frame->bitrate;
    auVar8._8_4_ = (int)(uVar2 >> 0x20);
    auVar8._0_8_ = uVar2;
    auVar8._12_4_ = 0x45300000;
    dVar6 = (((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 8.0 * 1000.0) /
            ((auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
    uVar4 = (ulong)dVar6;
    frame->usec = uVar4 | (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f;
    return;
  }
  __assert_fail("frame != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3.c",0x31,
                "void mp3_calc_hdr(mp3_frame_t *)");
}

Assistant:

void mp3_calc_hdr(mp3_frame_t *frame) {
  assert(frame != NULL);

  const int is_lsf = frame->id != MPEG_VERSION_1; // MPEG 2 and 2.5 are Lower Sampling Frequency extension

  if (is_lsf) {
    frame->bitrate = lsf_bitratetable[frame->bitrate_index];
  } else {
    frame->bitrate = bitratetable[frame->bitrate_index];

  }
  frame->samplerate = sampleratetable[frame->id][frame->samplerfindex];
  frame->samplelen = 1152; /* only layer III */
  if (is_lsf) {
    frame->si_size = frame->mode != (unsigned char) 3 ? 17 : 9;
  } else {
    frame->si_size = frame->mode != (unsigned char) 3 ? 32 : 17;
  }
  frame->si_bitsize = frame->si_size * 8;

  /* calculate frame length */
  if (is_lsf) {
    frame->frame_size = 72000 * frame->bitrate;
  } else {
    frame->frame_size = 144000 * frame->bitrate;
  }
  frame->frame_size /= frame->samplerate;
  frame->frame_size += frame->padding_bit;

  frame->frame_data_size = frame->frame_size - 4 - frame->si_size;
  if (frame->protected == 0)
    frame->frame_data_size -= 2;

  frame->usec = (double) frame->frame_size * 8 * 1000.0 / ((double) frame->bitrate);
}